

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O3

logmath_t * logmath_init(float64 base,int shift,int use_table)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  logmath_t *plVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  if ((double)base <= 1.0) {
    plVar4 = (logmath_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0x48,"Base must be greater than 1.0\n");
  }
  else {
    plVar4 = (logmath_t *)
             __ckd_calloc__(1,0x50,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                            ,0x4d);
    plVar4->refcount = 1;
    plVar4->base = base;
    dVar9 = log((double)base);
    plVar4->log_of_base = (float64)dVar9;
    dVar9 = log10((double)base);
    plVar4->log10_of_base = (float64)dVar9;
    auVar12._8_8_ = dVar9;
    auVar12._0_8_ = plVar4->log_of_base;
    auVar12 = divpd(_DAT_00117d00,auVar12);
    bVar1 = (byte)shift;
    plVar4->inv_log_of_base = (float64)auVar12._0_8_;
    plVar4->inv_log10_of_base = (float64)auVar12._8_8_;
    (plVar4->t).shift = bVar1;
    plVar4->zero = -0x80000000 >> (bVar1 + 2 & 0x1f);
    if (use_table != 0) {
      dVar9 = log((double)base);
      uVar2 = (uint)(long)(0.6931471805599453 / dVar9 + 0.5) >> (bVar1 & 0x1f);
      uVar7 = (uint)(0xffff < uVar2) * 2 + 2;
      if (uVar2 < 0x100) {
        uVar7 = 1;
      }
      (plVar4->t).width = (uint8)uVar7;
      dVar9 = (double)(1 << (bVar1 & 0x1f));
      uVar8 = 0;
      uVar2 = 0;
      if (0 < (int)(dVar9 * 0.5 + (double)plVar4->inv_log_of_base * 0.6931471805599453) >>
              (bVar1 & 0x1f)) {
        uVar2 = 0;
        dVar10 = 1.0;
        do {
          dVar10 = dVar10 / (double)base;
          uVar2 = uVar2 + 1;
          dVar11 = log(dVar10 + 1.0);
        } while (0 < (int)(dVar11 * (double)plVar4->inv_log_of_base + dVar9 * 0.5) >> (bVar1 & 0x1f)
                );
      }
      uVar2 = uVar2 >> (bVar1 & 0x1f);
      uVar6 = 0xff;
      if (0xff < uVar2) {
        uVar6 = uVar2;
      }
      pvVar5 = __ckd_calloc__((ulong)(uVar6 + 1),(ulong)uVar7,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                              ,0x77);
      (plVar4->t).table = pvVar5;
      (plVar4->t).table_size = uVar6 + 1;
      dVar10 = 1.0;
      do {
        dVar11 = log(dVar10 + 1.0);
        iVar3 = (int)(dVar11 * (double)plVar4->inv_log_of_base + dVar9 * 0.5) >> (bVar1 & 0x1f);
        uVar2 = (uint)uVar8;
        if (uVar7 == 4) {
          pvVar5 = (plVar4->t).table;
          uVar6 = *(uint *)((long)pvVar5 + (ulong)(uVar2 >> (bVar1 & 0x1f)) * 4);
LAB_0010da34:
          if (uVar6 == 0) {
            if (uVar7 == 4) {
              *(int *)((long)pvVar5 + (ulong)(uVar2 >> (bVar1 & 0x1f)) * 4) = iVar3;
            }
            else if (uVar7 == 2) {
              *(short *)((long)pvVar5 + (ulong)(uVar2 >> (bVar1 & 0x1f)) * 2) = (short)iVar3;
            }
            else if (uVar7 == 1) {
              *(char *)((long)pvVar5 + (uVar8 >> (bVar1 & 0x3f))) = (char)iVar3;
            }
          }
        }
        else {
          if (uVar7 == 2) {
            pvVar5 = (plVar4->t).table;
            uVar6 = (uint)*(ushort *)((long)pvVar5 + (ulong)(uVar2 >> (bVar1 & 0x1f)) * 2);
            goto LAB_0010da34;
          }
          if (uVar7 == 1) {
            pvVar5 = (plVar4->t).table;
            uVar6 = (uint)*(byte *)((long)pvVar5 + (uVar8 >> (bVar1 & 0x3f)));
            goto LAB_0010da34;
          }
        }
        if (iVar3 < 1) {
          return plVar4;
        }
        dVar10 = dVar10 / (double)base;
        uVar8 = (ulong)(uVar2 + 1);
      } while( true );
    }
  }
  return plVar4;
}

Assistant:

logmath_t *
logmath_init(float64 base, int shift, int use_table)
{
    logmath_t *lmath;
    uint32 maxyx, i;
    float64 byx;
    int width;

    /* Check that the base is correct. */
    if (base <= 1.0) {
        E_ERROR("Base must be greater than 1.0\n");
        return NULL;
    }
    
    /* Set up various necessary constants. */
    lmath = ckd_calloc(1, sizeof(*lmath));
    lmath->refcount = 1;
    lmath->base = base;
    lmath->log_of_base = log(base);
    lmath->log10_of_base = log10(base);
    lmath->inv_log_of_base = 1.0/lmath->log_of_base;
    lmath->inv_log10_of_base = 1.0/lmath->log10_of_base;
    lmath->t.shift = shift;
    /* Shift this sufficiently that overflows can be avoided. */
    lmath->zero = MAX_NEG_INT32 >> (shift + 2);

    if (!use_table)
        return lmath;

    /* Create a logadd table with the appropriate width */
    maxyx = (uint32) (log(2.0) / log(base) + 0.5) >> shift;
    /* Poor man's log2 */
    if (maxyx < 256) width = 1;
    else if (maxyx < 65536) width = 2;
    else width = 4;

    lmath->t.width = width;
    /* Figure out size of add table required. */
    byx = 1.0; /* Maximum possible base^{y-x} value - note that this implies that y-x == 0 */
    for (i = 0;; ++i) {
        float64 lobyx = log(1.0 + byx) * lmath->inv_log_of_base; /* log_{base}(1 + base^{y-x}); */
        int32 k = (int32) (lobyx + 0.5 * (1<<shift)) >> shift; /* Round to shift */

        /* base^{y-x} has reached the smallest representable value. */
        if (k <= 0)
            break;

        /* This table is indexed by -(y-x), so we multiply byx by
         * base^{-1} here which is equivalent to subtracting one from
         * (y-x). */
        byx /= base;
    }
    i >>= shift;

    /* Never produce a table smaller than 256 entries. */
    if (i < 255) i = 255;

    lmath->t.table = ckd_calloc(i+1, width);
    lmath->t.table_size = i + 1;
    /* Create the add table (see above). */
    byx = 1.0;
    for (i = 0;; ++i) {
        float64 lobyx = log(1.0 + byx) * lmath->inv_log_of_base;
        int32 k = (int32) (lobyx + 0.5 * (1<<shift)) >> shift; /* Round to shift */
        uint32 prev = 0;

        /* Check any previous value - if there is a shift, we want to
         * only store the highest one. */
        switch (width) {
        case 1:
            prev = ((uint8 *)lmath->t.table)[i >> shift];
            break;
        case 2:
            prev = ((uint16 *)lmath->t.table)[i >> shift];
            break;
        case 4:
            prev = ((uint32 *)lmath->t.table)[i >> shift];
            break;
        }
        if (prev == 0) {
            switch (width) {
            case 1:
                ((uint8 *)lmath->t.table)[i >> shift] = (uint8) k;
                break;
            case 2:
                ((uint16 *)lmath->t.table)[i >> shift] = (uint16) k;
                break;
            case 4:
                ((uint32 *)lmath->t.table)[i >> shift] = (uint32) k;
                break;
            }
        }
        if (k <= 0)
            break;

        /* Decay base^{y-x} exponentially according to base. */
        byx /= base;
    }

    return lmath;
}